

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mlneuron.cxx
# Opt level: O2

void __thiscall
MlCalciumChannel::MlCalciumChannel
          (MlCalciumChannel *this,double weight,double reversal,string *name,string *type)

{
  allocator<char> local_ba;
  allocator<char> local_b9;
  string local_b8;
  string local_98;
  Unit local_78;
  
  StochasticFunction::StochasticFunction(&this->super_StochasticFunction,(Time *)0x0,name,type);
  (this->super_StochasticFunction).super_StochasticProcess.super_Parametric._vptr_Parametric =
       (_func_int **)&PTR__StochasticProcess_00155888;
  (this->super_StochasticFunction).super_StochasticProcess.super_TimeDependent._vptr_TimeDependent =
       (_func_int **)&PTR__MlCalciumChannel_00155938;
  (this->super_StochasticFunction).super_StochasticProcess.super_Physical._vptr_Physical =
       (_func_int **)&PTR__MlCalciumChannel_00155980;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,"m",&local_ba);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_b8,"V",&local_b9);
  Unit::Unit(&local_78,&local_98,&local_b8);
  Unit::operator=(&(this->super_StochasticFunction).super_StochasticProcess.super_Physical.
                   physicalUnit,&local_78);
  Unit::~Unit(&local_78);
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_78,"reversal-potential",&local_ba);
  Parametric::addParameter((Parametric *)this,(string *)&local_78);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,"weight",&local_ba);
  Parametric::addParameter((Parametric *)this,(string *)&local_78);
  std::__cxx11::string::~string((string *)&local_78);
  return;
}

Assistant:

MlCalciumChannel::MlCalciumChannel(double weight, double reversal, const string& name, const string& type)
	: StochasticFunction(0, name, type)
{
	physicalUnit = Unit("m","V");
	addParameter("reversal-potential");
	addParameter("weight");
}